

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

TypedDeepImageChannel<Imath_3_2::half> * __thiscall
Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::slice(TypedDeepImageChannel<Imath_3_2::half> *this)

{
  PixelType PVar1;
  undefined8 *in_RSI;
  
  PVar1 = (**(code **)*in_RSI)();
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)this,PVar1,(char *)in_RSI[7],8,(long)*(int *)((long)in_RSI + 0x1c) << 3,2,
             *(int *)(in_RSI + 2),*(int *)((long)in_RSI + 0x14),0.0,false,false);
  return this;
}

Assistant:

DeepSlice
TypedDeepImageChannel<T>::slice () const
{
    return DeepSlice (
        pixelType (),                  // type
        (char*) _base,                 // base
        sizeof (T*),                   // xStride
        pixelsPerRow () * sizeof (T*), // yStride
        sizeof (T),                    // sampleStride
        xSampling (),
        ySampling ());
}